

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QXmlStreamNamespaceDeclaration>::begin(QList<QXmlStreamNamespaceDeclaration> *this)

{
  QXmlStreamNamespaceDeclaration *n;
  QArrayDataPointer<QXmlStreamNamespaceDeclaration> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QXmlStreamNamespaceDeclaration> *)0x659a49);
  QArrayDataPointer<QXmlStreamNamespaceDeclaration>::operator->(in_RDI);
  n = QArrayDataPointer<QXmlStreamNamespaceDeclaration>::begin
                ((QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)0x659a5a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }